

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O2

void __thiscall
SceneRender::commandsInit(SceneRender *this,CommandList *_commands,Uniforms *_uniforms)

{
  allocator local_283;
  allocator local_282;
  allocator local_281;
  string local_280;
  string local_260;
  string local_240;
  Command local_220;
  _Any_data local_198;
  code *local_188;
  code *local_180;
  _Any_data local_178;
  code *local_168;
  code *local_160;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if (this->m_commands_loaded == false) {
    std::__cxx11::string::string((string *)&local_240,"model",&local_281);
    local_38._8_8_ = 0;
    local_20 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:61:46)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:61:46)>
               ::_M_manager;
    local_38._M_unused._M_object = _uniforms;
    std::__cxx11::string::string((string *)&local_260,"models",&local_282);
    std::__cxx11::string::string
              ((string *)&local_280,"print all the names of the models",&local_283);
    Command::Command(&local_220,&local_240,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_38,&local_260,&local_280,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_220);
    Command::~Command(&local_220);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string((string *)&local_240,"origin",&local_281);
    local_58._8_8_ = 0;
    local_40 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:93:47)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:93:47)>
               ::_M_manager;
    local_58._M_unused._M_object = this;
    std::__cxx11::string::string((string *)&local_260,"origin[,<x>,<y>,<z>]",&local_282);
    std::__cxx11::string::string((string *)&local_280,"get or set the origin position.",&local_283);
    Command::Command(&local_220,&local_240,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_58,&local_260,&local_280,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_220);
    Command::~Command(&local_220);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string((string *)&local_240,"material",&local_281);
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:108:49)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:108:49)>
               ::_M_manager;
    local_78._M_unused._M_object = _uniforms;
    std::__cxx11::string::string((string *)&local_260,"materials",&local_282);
    std::__cxx11::string::string((string *)&local_280,"print all the materials names",&local_283);
    Command::Command(&local_220,&local_240,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_78,&local_260,&local_280,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_220);
    Command::~Command(&local_220);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string((string *)&local_240,"blend",&local_281);
    local_98._8_8_ = 0;
    local_80 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:130:46)>
               ::_M_invoke;
    local_88 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:130:46)>
               ::_M_manager;
    local_98._M_unused._M_object = this;
    std::__cxx11::string::string
              ((string *)&local_260,"blend[,alpha|add|multiply|screen|substract]",&local_282);
    std::__cxx11::string::string((string *)&local_280,"get or set the blending modes",&local_283);
    Command::Command(&local_220,&local_240,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_98,&local_260,&local_280,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_220);
    Command::~Command(&local_220);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::_Function_base::~_Function_base((_Function_base *)&local_98);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string((string *)&local_240,"depth_test",&local_281);
    local_b8._8_8_ = 0;
    local_a0 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:157:51)>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:157:51)>
               ::_M_manager;
    local_b8._M_unused._M_object = this;
    std::__cxx11::string::string((string *)&local_260,"depth_test[,on|off]",&local_282);
    std::__cxx11::string::string((string *)&local_280,"turn on/off depth test",&local_283);
    Command::Command(&local_220,&local_240,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_b8,&local_260,&local_280,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_220);
    Command::~Command(&local_220);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::_Function_base::~_Function_base((_Function_base *)&local_b8);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string((string *)&local_240,"culling",&local_281);
    local_d8._8_8_ = 0;
    local_c0 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:174:48)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:174:48)>
               ::_M_manager;
    local_d8._M_unused._M_object = this;
    std::__cxx11::string::string((string *)&local_260,"culling[,none|front|back|both]",&local_282);
    std::__cxx11::string::string((string *)&local_280,"get or set the culling modes",&local_283);
    Command::Command(&local_220,&local_240,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_d8,&local_260,&local_280,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_220);
    Command::~Command(&local_220);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::_Function_base::~_Function_base((_Function_base *)&local_d8);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string((string *)&local_240,"dynamic_shadows",&local_281);
    local_f8._8_8_ = 0;
    local_e0 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:197:56)>
               ::_M_invoke;
    local_e8 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:197:56)>
               ::_M_manager;
    local_f8._M_unused._M_object = this;
    std::__cxx11::string::string((string *)&local_260,"dynamic_shadows[,on|off]",&local_282);
    std::__cxx11::string::string((string *)&local_280,"get or set dynamic shadows",&local_283);
    Command::Command(&local_220,&local_240,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_f8,&local_260,&local_280,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_220);
    Command::~Command(&local_220);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::_Function_base::~_Function_base((_Function_base *)&local_f8);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string((string *)&local_240,"floor_color",&local_281);
    local_100 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:214:52)>
                ::_M_invoke;
    local_108 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:214:52)>
                ::_M_manager;
    local_118._M_unused._M_object = this;
    local_118._8_8_ = _uniforms;
    std::__cxx11::string::string((string *)&local_260,"floor_color[,<r>,<g>,<b>]",&local_282);
    std::__cxx11::string::string
              ((string *)&local_280,"get or set the ground color of the skybox.",&local_283);
    Command::Command(&local_220,&local_240,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_118,&local_260,&local_280,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_220);
    Command::~Command(&local_220);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::_Function_base::~_Function_base((_Function_base *)&local_118);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string((string *)&local_240,"floor",&local_281);
    local_138._8_8_ = 0;
    local_120 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:233:46)>
                ::_M_invoke;
    local_128 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:233:46)>
                ::_M_manager;
    local_138._M_unused._M_object = this;
    std::__cxx11::string::string((string *)&local_260,"floor[,on|off|<subD_level>]",&local_282);
    std::__cxx11::string::string
              ((string *)&local_280,"show/hide floor or presice the subdivision level",&local_283);
    Command::Command(&local_220,&local_240,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_138,&local_260,&local_280,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_220);
    Command::~Command(&local_220);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::_Function_base::~_Function_base((_Function_base *)&local_138);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string((string *)&local_240,"grid",&local_281);
    local_158._8_8_ = 0;
    local_140 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:261:45)>
                ::_M_invoke;
    local_148 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:261:45)>
                ::_M_manager;
    local_158._M_unused._M_object = this;
    std::__cxx11::string::string((string *)&local_260,"grid[,on|off]",&local_282);
    std::__cxx11::string::string((string *)&local_280,"show/hide grid",&local_283);
    Command::Command(&local_220,&local_240,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_158,&local_260,&local_280,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_220);
    Command::~Command(&local_220);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::_Function_base::~_Function_base((_Function_base *)&local_158);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string((string *)&local_240,"axis",&local_281);
    local_178._8_8_ = 0;
    local_160 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:281:45)>
                ::_M_invoke;
    local_168 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:281:45)>
                ::_M_manager;
    local_178._M_unused._M_object = this;
    std::__cxx11::string::string((string *)&local_260,"axis[,on|off]",&local_282);
    std::__cxx11::string::string((string *)&local_280,"show/hide axis",&local_283);
    Command::Command(&local_220,&local_240,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_178,&local_260,&local_280,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_220);
    Command::~Command(&local_220);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::_Function_base::~_Function_base((_Function_base *)&local_178);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string((string *)&local_240,"bboxes",&local_281);
    local_198._8_8_ = 0;
    local_180 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:301:47)>
                ::_M_invoke;
    local_188 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:301:47)>
                ::_M_manager;
    local_198._M_unused._M_object = this;
    std::__cxx11::string::string((string *)&local_260,"bboxes[,on|off]",&local_282);
    std::__cxx11::string::string((string *)&local_280,"show/hide models bounding boxes",&local_283);
    Command::Command(&local_220,&local_240,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_198,&local_260,&local_280,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_220);
    Command::~Command(&local_220);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::_Function_base::~_Function_base((_Function_base *)&local_198);
    std::__cxx11::string::~string((string *)&local_240);
    this->m_commands_loaded = true;
  }
  return;
}

Assistant:

void SceneRender::commandsInit(CommandList& _commands, Uniforms& _uniforms) {
    if (!m_commands_loaded) {

        // ADD COMMANDS
        // ----------------------------------------- 
        _commands.push_back(Command("model", [&](const std::string& _line){ 
            if (_line == "models") {
                for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it)
                    std::cout << it->second->getName() << std::endl;
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it)
                        if (it->second->getName() == values[1]) {
                            it->second->printVboInfo();
                            std::cout << "Defines:" << std::endl;
                            it->second->printDefines();
                            std::cout << "Position:" << std::endl;
                            glm::vec3 pos = it->second->getPosition();
                            std::cout << pos.x << ',' << pos.y << ',' << pos.z << std::endl;
                            return true;
                        }
                }
                else if (values.size() == 5) {
                    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it)
                        if (it->second->getName() == values[1]) {
                            it->second->setPosition( glm::vec3(vera::toFloat(values[2]), vera::toFloat(values[3]), vera::toFloat(values[4])) );
                            return true;
                        }
                }
            }
            return false;
        },
        "models", "print all the names of the models"));

        _commands.push_back(Command("origin", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 4) {
                m_origin.setPosition( glm::vec3(vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3])) );
                return true;
            }
            else {
                glm::vec3 pos = m_origin.getPosition();
                std::cout << pos.x << ',' << pos.y << ',' << pos.z << std::endl;
                return true;
            }
            return false;
        },
        "origin[,<x>,<y>,<z>]", "get or set the origin position."));

        _commands.push_back(Command("material", [&](const std::string& _line){ 
            if (_line == "materials") {
                for (vera::MaterialsMap::iterator it = _uniforms.materials.begin(); it != _uniforms.materials.end(); it++)
                    std::cout << it->second->name << std::endl;
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2 && values[0] == "material") {
                    for (vera::MaterialsMap::iterator it = _uniforms.materials.begin(); it != _uniforms.materials.end(); it++) {
                        if (it->second->name == values[1]) {
                            it->second->printDefines();
                            return true;
                        }
                    }
                }
            }

            return false;
        },
        "materials", "print all the materials names"));

        _commands.push_back(Command("blend", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 1) {
                if (getBlend() == vera::BLEND_NONE) std::cout << "none" << std::endl;
                else if (getBlend() == vera::BLEND_ALPHA) std::cout << "alpha" << std::endl;
                else if (getBlend() == vera::BLEND_ADD) std::cout << "add" << std::endl;
                else if (getBlend() == vera::BLEND_MULTIPLY) std::cout << "multiply" << std::endl;
                else if (getBlend() == vera::BLEND_SCREEN) std::cout << "screen" << std::endl;
                else if (getBlend() == vera::BLEND_SUBSTRACT) std::cout << "substract" << std::endl;
                
                return true;
            }
            else if (values.size() == 2) {
                if (values[1] == "none" || values[1] == "off") setBlend(vera::BLEND_NONE);
                else if (values[1] == "alpha") setBlend(vera::BLEND_ALPHA);
                else if (values[1] == "add") setBlend(vera::BLEND_ADD);
                else if (values[1] == "multiply") setBlend(vera::BLEND_MULTIPLY);
                else if (values[1] == "screen") setBlend(vera::BLEND_SCREEN);
                else if (values[1] == "substract") setBlend(vera::BLEND_SUBSTRACT);

                return true;
            }

            return false;
        },
        "blend[,alpha|add|multiply|screen|substract]", "get or set the blending modes"));

        _commands.push_back(Command("depth_test", [&](const std::string& _line){ 
            if (_line == "depth_test") {
                std::string rta = m_depth_test ? "on" : "off";
                std::cout <<  rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    m_depth_test = (values[1] == "on");
                    return true;
                }
            }
            return false;
        },
        "depth_test[,on|off]", "turn on/off depth test"));

        _commands.push_back(Command("culling", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 1) {
                if (getCulling() == vera::CULL_NONE) std::cout << "none" << std::endl;
                else if (getCulling() == vera::CULL_FRONT) std::cout << "front" << std::endl;
                else if (getCulling() == vera::CULL_BACK) std::cout << "back" << std::endl;
                else if (getCulling() == vera::CULL_BOTH) std::cout << "both" << std::endl;

                return true;
            }
            else if (values.size() == 2) {
                if (values[1] == "none") setCulling(vera::CULL_NONE);
                else if (values[1] == "front") setCulling(vera::CULL_FRONT);
                else if (values[1] == "back") setCulling(vera::CULL_BACK);
                else if (values[1] == "both") setCulling(vera::CULL_BOTH);

                return true;
            }

            return false;
        },
        "culling[,none|front|back|both]", "get or set the culling modes"));
        
        _commands.push_back(Command("dynamic_shadows", [&](const std::string& _line){ 
            if (_line == "dynamic_shadows") {
                std::string rta = dynamicShadows ? "on" : "off";
                std::cout <<  rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    dynamicShadows = (values[1] == "on");
                    return true;
                }
            }
            return false;
        },
        "dynamic_shadows[,on|off]", "get or set dynamic shadows"));

        _commands.push_back(Command("floor_color", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 4) {
                std::string str_color = "vec4("+values[1]+","+values[2]+","+values[3]+",1.0)"; 
                addDefine("FLOOR_COLOR",str_color);
                
                _uniforms.setGroundAlbedo( glm::vec3(vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3])) );
                _uniforms.activeCubemap = _uniforms.cubemaps["default"];
                return true;
            }
            else {
                glm::vec3 ground = _uniforms.getGroundAlbedo();
                std::cout << ground.x << ',' << ground.y << ',' << ground.z << std::endl;
                return true;
            }
            return false;
        },
        "floor_color[,<r>,<g>,<b>]", "get or set the ground color of the skybox."));
        
        _commands.push_back(Command("floor", [&](const std::string& _line) {
            std::vector<std::string> values = vera::split(_line,',');

            if (_line == "floor") {
                std::string rta = m_floor_subd > 0 ? vera::toString(m_floor_subd) : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = m_floor_subd_target >= 0 ? "off" : "on";

                    if (values[1] == "off")
                        m_floor_subd_target = -1;
                    else if (values[1] == "on") {
                        if (m_floor_subd_target == -1)
                            m_floor_subd_target = 0;
                    }
                    else
                        m_floor_subd_target = vera::toInt(values[1]);
                    return true;
                }
            }
            return false;
        },
        "floor[,on|off|<subD_level>]", "show/hide floor or presice the subdivision level"));

        _commands.push_back(Command("grid", [&](const std::string& _line){
            if (_line == "grid") {
                std::string rta = showGrid ? "on" : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = showGrid ? "off" : "on";

                    showGrid = values[1] == "on";
                    return true;
                }
            }
            return false;
        },
        "grid[,on|off]", "show/hide grid"));

        _commands.push_back(Command("axis", [&](const std::string& _line){
            if (_line == "grid") {
                std::string rta = showAxis ? "on" : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = showAxis ? "off" : "on";

                    showAxis = values[1] == "on";
                    return true;
                }
            }
            return false;
        },
        "axis[,on|off]", "show/hide axis"));

        _commands.push_back(Command("bboxes", [&](const std::string& _line){
            if (_line == "bboxes") {
                std::string rta = showBBoxes ? "on" : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = showBBoxes ? "off" : "on";

                    showBBoxes = values[1] == "on";
                    return true;
                }
            }
            return false;
        },
        "bboxes[,on|off]", "show/hide models bounding boxes"));
        m_commands_loaded = true;
    }
}